

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_ocaml_struct_definition
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int *piVar1;
  ostream *poVar2;
  pointer pptVar3;
  pointer pptVar4;
  string tname;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  type_name_abi_cxx11_(&local_b0,this,&tstruct->super_t_type);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"class ");
  poVar2 = std::operator<<(poVar2,(string *)&local_b0);
  poVar2 = std::operator<<(poVar2," =");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"object (self)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar3 != pptVar4) {
    for (; pptVar4 != pptVar3; pptVar4 = pptVar4 + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)&local_b0);
      generate_ocaml_struct_member(this,out,&local_50,*pptVar4);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  generate_ocaml_method_copy(this,out,&tstruct->members_);
  generate_ocaml_struct_writer(this,out,tstruct);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"end");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if (is_exception) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"exception ");
    std::__cxx11::string::string((string *)&local_90,(string *)&local_b0);
    t_generator::capitalize(&local_70,(t_generator *)this,&local_90);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2," of ");
    poVar2 = std::operator<<(poVar2,(string *)&local_b0);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  generate_ocaml_struct_reader(this,out,tstruct);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_definition(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_exception) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  string tname = type_name(tstruct);
  indent(out) << "class " << tname << " =" << endl;
  indent(out) << "object (self)" << endl;

  indent_up();

  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      generate_ocaml_struct_member(out, tname, (*m_iter));
      out << endl;
    }
  }
  generate_ocaml_method_copy(out, members);
  generate_ocaml_struct_writer(out, tstruct);
  indent_down();
  indent(out) << "end" << endl;

  if (is_exception) {
    indent(out) << "exception " << capitalize(tname) << " of " << tname << endl;
  }

  generate_ocaml_struct_reader(out, tstruct);
}